

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.c
# Opt level: O0

void load_resets(FILE *fp)

{
  EXIT_DATA *pEVar1;
  string_view fmt;
  char cVar2;
  int iVar3;
  RESET_DATA *pReset_00;
  ROOM_INDEX_DATA *pRVar4;
  basic_string_view<char,_std::char_traits<char>_> *this;
  __type _Var5;
  char letter;
  EXIT_DATA *pexit;
  ROOM_INDEX_DATA *pRoomIndex;
  int iLastObj;
  int iLastRoom;
  RESET_DATA *pReset;
  FILE *in_stack_00002380;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  char *in_stack_ffffffffffffff68;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff70;
  short local_88;
  short local_84;
  CLogger *in_stack_ffffffffffffff80;
  size_t in_stack_ffffffffffffff88;
  short *in_stack_ffffffffffffff90;
  CLogger *in_stack_ffffffffffffff98;
  string_view in_stack_ffffffffffffffa0;
  
  if (area_last == (AREA_DATA_conflict *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    fmt._M_str = (char *)in_stack_ffffffffffffff90;
    fmt._M_len = in_stack_ffffffffffffff88;
    CLogger::Error<>(in_stack_ffffffffffffff80,fmt);
    exit(1);
  }
  do {
    while( true ) {
      cVar2 = fread_letter((FILE *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      if (cVar2 == 'S') {
        return;
      }
      if (cVar2 != '*') break;
      fread_to_eol((FILE *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    }
    pReset_00 = (RESET_DATA *)operator_new(0x18);
    pReset_00->command = cVar2;
    fread_number(in_stack_00002380);
    iVar3 = fread_number(in_stack_00002380);
    pReset_00->arg1 = (short)iVar3;
    iVar3 = fread_number(in_stack_00002380);
    pReset_00->arg2 = (short)iVar3;
    if ((cVar2 == 'G') || (cVar2 == 'R')) {
      local_84 = 0;
    }
    else {
      iVar3 = fread_number(in_stack_00002380);
      local_84 = (short)iVar3;
    }
    pReset_00->arg3 = local_84;
    if ((cVar2 == 'P') || (cVar2 == 'M')) {
      iVar3 = fread_number(in_stack_00002380);
      local_88 = (short)iVar3;
    }
    else {
      local_88 = 0;
    }
    pReset_00->arg4 = local_88;
    fread_to_eol((FILE *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    this = (basic_string_view<char,_std::char_traits<char>_> *)(ulong)((int)cVar2 - 0x44);
    iVar3 = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
    switch(this) {
    case (basic_string_view<char,_std::char_traits<char>_> *)0x0:
      pRVar4 = get_room_index(iVar3);
      if ((((pReset_00->arg2 < 0) || (5 < pReset_00->arg2)) || (pRVar4 == (ROOM_INDEX_DATA *)0x0))
         || (pEVar1 = pRVar4->exit[pReset_00->arg2], pEVar1 == (EXIT_DATA *)0x0)) {
LAB_001d37b7:
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (this,in_stack_ffffffffffffff68);
        CLogger::Error<short&>
                  (in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff90);
        exit(1);
      }
      in_stack_ffffffffffffff68 = (char *)pEVar1->exit_info[0];
      _Var5 = std::pow<int,int>(0,0x1d37a4);
      if (((ulong)in_stack_ffffffffffffff68 & (long)_Var5) == 0) goto LAB_001d37b7;
      in_stack_ffffffffffffff64 = (int)pReset_00->arg3;
      if (pReset_00->arg3 != 0) {
        if (in_stack_ffffffffffffff64 == 1) {
          _Var5 = std::pow<int,int>(0,0x1d383b);
          pEVar1->exit_info[0] = (long)_Var5 | pEVar1->exit_info[0];
        }
        else if (in_stack_ffffffffffffff64 == 2) {
          _Var5 = std::pow<int,int>(0,0x1d385e);
          pEVar1->exit_info[0] = (long)_Var5 | pEVar1->exit_info[0];
          _Var5 = std::pow<int,int>(0,0x1d387c);
          pEVar1->exit_info[0] = (long)_Var5 | pEVar1->exit_info[0];
        }
        else {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (this,in_stack_ffffffffffffff68);
          CLogger::Warn<short&>
                    (in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff90);
        }
      }
      break;
    case (basic_string_view<char,_std::char_traits<char>_> *)0x1:
    case (basic_string_view<char,_std::char_traits<char>_> *)0x3:
      get_obj_index(iVar3);
      pRVar4 = get_room_index((int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
      if (pRVar4 != (ROOM_INDEX_DATA *)0x0) {
        new_reset(pRVar4,pReset_00);
      }
      break;
    default:
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (this,in_stack_ffffffffffffff68);
      CLogger::Error<char&>
                (in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0,
                 (char *)in_stack_ffffffffffffff90);
      exit(1);
    case (basic_string_view<char,_std::char_traits<char>_> *)0x9:
      get_mob_index(iVar3);
      pRVar4 = get_room_index((int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
      if (pRVar4 != (ROOM_INDEX_DATA *)0x0) {
        new_reset(pRVar4,pReset_00);
      }
      break;
    case (basic_string_view<char,_std::char_traits<char>_> *)0xb:
      get_obj_index(iVar3);
      pRVar4 = get_room_index((int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
      if (pRVar4 != (ROOM_INDEX_DATA *)0x0) {
        new_reset(pRVar4,pReset_00);
      }
      break;
    case (basic_string_view<char,_std::char_traits<char>_> *)0xc:
      get_obj_index(iVar3);
      pRVar4 = get_room_index((int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
      if (pRVar4 != (ROOM_INDEX_DATA *)0x0) {
        new_reset(pRVar4,pReset_00);
      }
      break;
    case (basic_string_view<char,_std::char_traits<char>_> *)0xe:
      pRVar4 = get_room_index(iVar3);
      if ((pReset_00->arg2 < 0) || (6 < pReset_00->arg2)) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (this,in_stack_ffffffffffffff68);
        CLogger::Error<short&>
                  (in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff90);
        exit(1);
      }
      if (pRVar4 != (ROOM_INDEX_DATA *)0x0) {
        new_reset(pRVar4,pReset_00);
      }
    }
    pReset_00->next = (RESET_DATA *)0x0;
    top_reset = top_reset + 1;
  } while( true );
}

Assistant:

void load_resets(FILE *fp)
{
	RESET_DATA *pReset;
	int iLastRoom = 0;
	int iLastObj = 0;

	if (!area_last)
	{
		RS.Logger.Error("Load_resets: no #AREA seen yet.");
		exit(1);
	}

	for (;;)
	{
		ROOM_INDEX_DATA *pRoomIndex;
		EXIT_DATA *pexit = nullptr;
		char letter;
		/*
		OBJ_INDEX_DATA *temp_index;
		int temp;
		*/

		letter = fread_letter(fp);

		if (letter == 'S')
			break;

		if (letter == '*')
		{
			fread_to_eol(fp);
			continue;
		}

		pReset = new RESET_DATA;
		pReset->command = letter;

		/* if_flag */ fread_number(fp);

		pReset->arg1 = fread_number(fp);
		pReset->arg2 = fread_number(fp);
		pReset->arg3 = (letter == 'G' || letter == 'R') ? 0 : fread_number(fp);
		pReset->arg4 = (letter == 'P' || letter == 'M') ? fread_number(fp) : 0;

		/*
		pReset->arg4 = (letter == 'P' || letter == 'M')
			? ((temp == 0) ? 1 : fread_number(fp))
			: 0;
		*/

		fread_to_eol(fp);

		/*
		 * Validate parameters.
		 * We're calling the index functions for the side effect.
		 */
		switch (letter)
		{
			case 'M':
				get_mob_index(pReset->arg1);

				/*
				get_room_index(pReset->arg3);
				*/

				pRoomIndex = get_room_index(pReset->arg3);

				if (pRoomIndex)
				{
					new_reset(pRoomIndex, pReset);
					iLastRoom = pReset->arg3;
				}

				break;
			case 'O':
				/*
				temp_index = get_obj_index(pReset->arg1);
				temp_index->reset_num++;
				get_room_index(pReset->arg3);
				*/

				get_obj_index(pReset->arg1);

				pRoomIndex = get_room_index(pReset->arg3);

				if (pRoomIndex)
				{
					new_reset(pRoomIndex, pReset);
					iLastObj = pReset->arg3;
				}

				break;
			case 'P':
				/*
				temp_index = get_obj_index(pReset->arg1);
				temp_index->reset_num++;
				get_obj_index(pReset->arg3);
				*/

				get_obj_index(pReset->arg1);
				
				pRoomIndex = get_room_index(iLastObj);

				if (pRoomIndex)
					new_reset(pRoomIndex, pReset);

				break;
			case 'G':
			case 'E':
				/*
				temp_index = get_obj_index(pReset->arg1);
				temp_index->reset_num++;
				*/

				get_obj_index(pReset->arg1);

				pRoomIndex = get_room_index(iLastRoom);

				if (pRoomIndex)
				{
					new_reset(pRoomIndex, pReset);
					iLastObj = iLastRoom;
				}

				break;
			case 'D':
				pRoomIndex = get_room_index(pReset->arg1);

				if (pReset->arg2 < 0
					|| pReset->arg2 > 5
					|| !pRoomIndex
					|| !(pexit = pRoomIndex->exit[pReset->arg2])
					|| !IS_SET(pexit->exit_info, EX_ISDOOR))
				{
					RS.Logger.Error("Load_resets: 'D': exit {} not door.", pReset->arg2);
					exit(1);
				}

				/*
				if (pReset->arg3 < 0 || pReset->arg3 > 2)
				{
					RS.Logger.Error("Load_resets: 'D': bad 'locks': %d.", pReset->arg3);
					exit(1);
				}
				*/

				switch (pReset->arg3)
				{
					case 0:
						break;
					case 1:
						SET_BIT(pexit->exit_info, EX_CLOSED);
						break;
					case 2:
						SET_BIT(pexit->exit_info, EX_CLOSED);
						SET_BIT(pexit->exit_info, EX_LOCKED);
						break;
					default:
						RS.Logger.Warn("Load_resets: 'D': bad 'locks': {}.", pReset->arg3);
						break;
				}

				break;
			case 'R':
				pRoomIndex = get_room_index(pReset->arg1);

				if (pReset->arg2 < 0 || pReset->arg2 > 6)
				{
					RS.Logger.Error("Load_resets: 'R': bad exit {}.", pReset->arg2);
					exit(1);
				}

				if (pRoomIndex)
					new_reset(pRoomIndex, pReset);

				break;
			default:
				RS.Logger.Error("Load_resets: bad command '{}'.", letter);
				exit(1);
				break;
		}

		/*
		if (area_last->reset_first == nullptr)
			area_last->reset_first = pReset;
	
		if (area_last->reset_last != nullptr)
			area_last->reset_last->next	= pReset;

		area_last->reset_last = pReset;
		*/
		pReset->next = nullptr;
		top_reset++;
	}
}